

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void kj::_::
     freePromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>>>
               (SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
                *ptr)

{
  SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
  *ptr_local;
  
  dtor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>>>
            (ptr);
  return;
}

Assistant:

static void freePromise(T* ptr) {
  // Free a PromiseNode originally allocated using `allocPromise<T>()`. The implementation of
  // PromiseNode::destroy() must call this for any type that is allocated using allocPromise().

  if constexpr (PromiseDisposer::canArenaAllocate<T>()) {
    // The object will have been allocated in an arena, so we only want to run the destructor.
    // The arena's memory will be freed separately.
    kj::dtor(*ptr);
  } else {
    // The object will have been allocated separately on the heap.
    return delete ptr;
  }
}